

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

void raviX_destroy_linearizer(LinearizerState *linearizer)

{
  undefined1 local_30 [8];
  PtrListIterator prociter__;
  Proc *proc;
  LinearizerState *linearizer_local;
  
  if (linearizer != (LinearizerState *)0x0) {
    raviX_ptrlist_forward_iterator((PtrListIterator *)local_30,(PtrList *)linearizer->all_procs);
    prociter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)local_30);
    while (prociter__._16_8_ != 0) {
      if (*(long *)(prociter__._16_8_ + 0xf8) != 0) {
        raviX_set_destroy(*(Set **)(prociter__._16_8_ + 0xf8),(_func_void_SetEntry_ptr *)0x0);
      }
      if (*(long *)(prociter__._16_8_ + 0x108) != 0) {
        raviX_destroy_graph(*(Graph **)(prociter__._16_8_ + 0x108));
      }
      prociter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)local_30);
    }
    raviX_buffer_free(&linearizer->C_declarations);
    raviX_free(linearizer);
  }
  return;
}

Assistant:

void raviX_destroy_linearizer(LinearizerState *linearizer)
{
	if (linearizer == NULL)
		return;
	Proc *proc;
	FOR_EACH_PTR(linearizer->all_procs, Proc, proc)
	{
		if (proc->constants)
			raviX_set_destroy(proc->constants, NULL);
		if (proc->cfg) 
			raviX_destroy_graph(proc->cfg);
	}
	END_FOR_EACH_PTR(proc)
	raviX_buffer_free(&linearizer->C_declarations);
	raviX_free(linearizer);
}